

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNpnSave.c
# Opt level: O1

Npn_Obj_t * Npn_ManAdd(Npn_Man_t *p,word uTruth)

{
  int iVar1;
  Npn_Obj_t *pNVar2;
  Npn_Obj_t *pNVar3;
  int iVar4;
  int *piVar5;
  
  iVar1 = p->nBins;
  iVar4 = p->nBufferSize;
  if (p->nEntries == iVar4) {
    p->nBufferSize = iVar4 * 2;
    if (p->pBuffer == (Npn_Obj_t *)0x0) {
      pNVar2 = (Npn_Obj_t *)malloc((long)iVar4 << 5);
    }
    else {
      pNVar2 = (Npn_Obj_t *)realloc(p->pBuffer,(long)iVar4 << 5);
    }
    p->pBuffer = pNVar2;
  }
  iVar4 = (int)((uTruth * 0x6f1 ^ uTruth * 0x2dd ^ uTruth * 0x65) % (ulong)(long)iVar1);
  iVar1 = p->pBins[iVar4];
  if (iVar1 < p->nBufferSize) {
    if (iVar1 == 0) {
      pNVar2 = (Npn_Obj_t *)0x0;
    }
    else {
      pNVar2 = p->pBuffer + iVar1;
    }
    if (pNVar2 == (Npn_Obj_t *)0x0) {
      piVar5 = p->pBins + iVar4;
    }
    else {
      do {
        pNVar3 = pNVar2;
        if (pNVar3->uTruth == uTruth) {
          pNVar3->Count = pNVar3->Count + 1;
          return pNVar3;
        }
        iVar1 = pNVar3->iNext;
        if (p->nBufferSize <= iVar1) goto LAB_00276c75;
        if (iVar1 == 0) {
          pNVar2 = (Npn_Obj_t *)0x0;
        }
        else {
          pNVar2 = p->pBuffer + iVar1;
        }
      } while (pNVar2 != (Npn_Obj_t *)0x0);
      piVar5 = &pNVar3->iNext;
    }
    *piVar5 = p->nEntries;
    iVar1 = p->nEntries;
    if (iVar1 < p->nBufferSize) {
      p->nEntries = iVar1 + 1;
      pNVar2 = p->pBuffer;
      pNVar2[iVar1].uTruth = uTruth;
      pNVar2[iVar1].Count = 1;
      pNVar2[iVar1].iNext = 0;
      if (SBORROW4(iVar1,p->nBins * 3) == iVar1 + p->nBins * -3 < 0) {
        Npn_ManResize(p);
      }
      return pNVar2 + iVar1;
    }
    __assert_fail("p->nEntries < p->nBufferSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcNpnSave.c"
                  ,0x1cc,"Npn_Obj_t *Npn_ManAdd(Npn_Man_t *, word)");
  }
LAB_00276c75:
  __assert_fail("i < p->nBufferSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcNpnSave.c"
                ,0x31,"Npn_Obj_t *Npn_ManObj(Npn_Man_t *, int)");
}

Assistant:

Npn_Obj_t * Npn_ManAdd( Npn_Man_t * p, word uTruth )
{
    Npn_Obj_t * pEntry;
    int * pPlace, Key = Npn_ManHash( p, uTruth );
    // resize the link storage if needed
    if ( p->nEntries == p->nBufferSize )
    {
        p->nBufferSize *= 2;
        p->pBuffer = ABC_REALLOC( Npn_Obj_t, p->pBuffer, p->nBufferSize );
    }
    // find the entry
    for ( pEntry = Npn_ManObj(p, p->pBins[Key]), 
          pPlace = p->pBins + Key; 
          pEntry; 
          pPlace = &pEntry->iNext, 
          pEntry = Npn_ManObj(p, pEntry->iNext) )
        if ( pEntry->uTruth == uTruth )
        {
            pEntry->Count++;
            return pEntry;
        }
    // create new entry
    *pPlace = p->nEntries;
    assert( p->nEntries < p->nBufferSize );
    pEntry = Npn_ManObj( p, p->nEntries++ );
    pEntry->uTruth = uTruth;
    pEntry->Count = 1;
    pEntry->iNext = 0;
    // resize the table if needed
    if ( p->nEntries > 3 * p->nBins )
        Npn_ManResize( p );
    return pEntry;
}